

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_udp.cpp
# Opt level: O0

int __thiscall
miniros::TransportUDP::connect(TransportUDP *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  Level LVar1;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  in_addr_t iVar5;
  uint uVar6;
  undefined7 extraout_var;
  char *pcVar7;
  ulong extraout_RAX;
  undefined8 uVar8;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ostream *poVar9;
  ulong uVar10;
  undefined4 in_register_00000034;
  bool enabled_5;
  stringstream ss;
  bool enabled_4;
  bool enabled_3;
  bool enabled_2;
  addrinfo *it;
  bool found;
  bool enabled_1;
  addrinfo hints;
  addrinfo *addr;
  sockaddr_in sin;
  bool enabled;
  undefined8 in_stack_fffffffffffffbc8;
  LogLocation *in_stack_fffffffffffffbd0;
  undefined8 in_stack_fffffffffffffbd8;
  undefined4 uVar11;
  LogLocation *in_stack_fffffffffffffbe0;
  undefined4 uVar12;
  undefined8 in_stack_fffffffffffffbf0;
  Level level;
  void *pvVar13;
  undefined4 in_stack_fffffffffffffbf8;
  Level LVar14;
  undefined4 in_stack_fffffffffffffbfc;
  LogLocation *in_stack_fffffffffffffc00;
  LogLocation *loc;
  char *in_stack_fffffffffffffc08;
  string *this_00;
  undefined7 in_stack_fffffffffffffc10;
  undefined1 in_stack_fffffffffffffc17;
  string *in_stack_fffffffffffffcb0;
  Transport *in_stack_fffffffffffffcb8;
  TransportUDP *in_stack_fffffffffffffcc8;
  LogLocation local_321 [2];
  undefined4 local_2fc;
  string local_2f8 [32];
  stringstream local_2d8 [16];
  ostream local_2c8 [64];
  allocator<char> local_149;
  string local_148 [32];
  in_addr_t local_128;
  undefined1 local_122;
  allocator<char> local_121;
  string local_120 [38];
  undefined1 local_fa;
  allocator<char> local_f9;
  string local_f8 [32];
  addrinfo *local_d8;
  byte local_cb;
  undefined1 local_ca;
  allocator<char> local_c9;
  string local_c8 [32];
  addrinfo local_a8;
  addrinfo *local_78;
  undefined1 local_70 [19];
  undefined1 local_5d;
  allocator<char> local_49;
  string local_48 [32];
  socklen_t local_28;
  int local_24;
  string *local_20;
  TransportUDP *local_18;
  undefined1 local_9;
  
  uVar11 = (undefined4)((ulong)in_stack_fffffffffffffbd8 >> 0x20);
  LVar14 = (Level)((ulong)in_stack_fffffffffffffbc8 >> 0x20);
  level = (Level)((ulong)in_stack_fffffffffffffbf0 >> 0x20);
  local_20 = (string *)CONCAT44(in_register_00000034,__fd);
  local_24 = (int)__addr;
  local_28 = __len;
  local_18 = this;
  bVar2 = Transport::isHostAllowed(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  uVar10 = CONCAT71(extraout_var,bVar2);
  if (bVar2) {
    iVar4 = socket(2,2,0);
    this->sock_ = iVar4;
    this->connection_id_ = local_28;
    if (this->sock_ == -1) {
      if (((CONCAT71(0x6410,console::g_initialized) ^ 0xff) & 1) != 0) {
        console::initialize();
      }
      if (((connect::loc.initialized_ ^ 0xffU) & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
                   in_stack_fffffffffffffc08,(allocator<char> *)in_stack_fffffffffffffc00);
        console::initializeLogLocation
                  (in_stack_fffffffffffffc00,
                   (string *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),level);
        std::__cxx11::string::~string(local_48);
        std::allocator<char>::~allocator(&local_49);
      }
      if (connect::loc.level_ != Error) {
        console::setLogLocationLevel(in_stack_fffffffffffffbd0,LVar14);
        console::checkLogLocationEnabled(in_stack_fffffffffffffbe0);
      }
      LVar14 = connect::loc.level_;
      local_5d = (connect::loc.logger_enabled_ & 1U) != 0;
      uVar10 = 0;
      if ((bool)local_5d) {
        pvVar13 = connect::loc.logger_;
        pcVar7 = last_socket_error_string();
        console::print((FilterBase *)0x0,pvVar13,(Level)(ulong)LVar14,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_udp.cpp"
                       ,0xa1,"bool miniros::TransportUDP::connect(const std::string &, int, int)",
                       "socket() failed with error [%s]",pcVar7);
        uVar10 = extraout_RAX;
      }
      local_9 = 0;
    }
    else {
      memset(local_70,0,0x10);
      local_70._0_2_ = 2;
      pcVar7 = (char *)std::__cxx11::string::c_str();
      iVar5 = inet_addr(pcVar7);
      if (iVar5 == 0xffffffff) {
        memset(&local_a8,0,0x30);
        local_a8.ai_family = 0;
        pcVar7 = (char *)std::__cxx11::string::c_str();
        iVar4 = getaddrinfo(pcVar7,(char *)0x0,&local_a8,&local_78);
        if (iVar4 != 0) {
          (*(this->super_Transport)._vptr_Transport[8])();
          if (((CONCAT71(0x6410,console::g_initialized) ^ 0xff) & 1) != 0) {
            console::initialize();
          }
          if (((connect(std::__cxx11::string_const&,int,int)::loc.initialized_ ^ 0xffU) & 1) != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
                       in_stack_fffffffffffffc08,(allocator<char> *)in_stack_fffffffffffffc00);
            console::initializeLogLocation
                      (in_stack_fffffffffffffc00,
                       (string *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),level
                      );
            std::__cxx11::string::~string(local_c8);
            std::allocator<char>::~allocator(&local_c9);
          }
          if (connect(std::__cxx11::string_const&,int,int)::loc.level_ != Error) {
            console::setLogLocationLevel(in_stack_fffffffffffffbd0,LVar14);
            console::checkLogLocationEnabled(in_stack_fffffffffffffbe0);
          }
          pvVar13 = connect(std::__cxx11::string_const&,int,int)::loc.logger_;
          LVar14 = connect(std::__cxx11::string_const&,int,int)::loc.level_;
          local_ca = (connect(std::__cxx11::string_const&,int,int)::loc.logger_enabled_ & 1U) != 0;
          uVar10 = 0;
          if ((bool)local_ca) {
            uVar8 = std::__cxx11::string::c_str();
            console::print((FilterBase *)0x0,pvVar13,(Level)(ulong)LVar14,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_udp.cpp"
                           ,0xb1,
                           "bool miniros::TransportUDP::connect(const std::string &, int, int)",
                           "couldn\'t resolve host [%s]",uVar8);
            uVar10 = extraout_RAX_00;
          }
          local_9 = 0;
          goto LAB_00506869;
        }
        local_cb = 0;
        for (local_d8 = local_78; local_d8 != (addrinfo *)0x0; local_d8 = local_d8->ai_next) {
          if (local_d8->ai_family == 2) {
            memcpy(local_70,local_d8->ai_addr,(ulong)local_d8->ai_addrlen);
            local_70._0_2_ = (undefined2)local_d8->ai_family;
            local_70._2_2_ = htons((uint16_t)local_24);
            local_cb = 1;
            break;
          }
        }
        freeaddrinfo(local_78);
        if ((local_cb & 1) == 0) {
          if (((CONCAT71(0x6410,console::g_initialized) ^ 0xff) & 1) != 0) {
            console::initialize();
          }
          if (((connect(std::__cxx11::string_const&,int,int)::loc.initialized_ ^ 0xffU) & 1) != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
                       in_stack_fffffffffffffc08,(allocator<char> *)in_stack_fffffffffffffc00);
            console::initializeLogLocation
                      (in_stack_fffffffffffffc00,
                       (string *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),level
                      );
            std::__cxx11::string::~string(local_f8);
            std::allocator<char>::~allocator(&local_f9);
          }
          if (connect(std::__cxx11::string_const&,int,int)::loc.level_ != Error) {
            console::setLogLocationLevel(in_stack_fffffffffffffbd0,LVar14);
            console::checkLogLocationEnabled(in_stack_fffffffffffffbe0);
          }
          pvVar13 = connect(std::__cxx11::string_const&,int,int)::loc.logger_;
          LVar14 = connect(std::__cxx11::string_const&,int,int)::loc.level_;
          local_fa = (connect(std::__cxx11::string_const&,int,int)::loc.logger_enabled_ & 1U) != 0;
          uVar10 = 0;
          if ((bool)local_fa) {
            uVar8 = std::__cxx11::string::c_str();
            console::print((FilterBase *)0x0,pvVar13,(Level)(ulong)LVar14,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_udp.cpp"
                           ,200,"bool miniros::TransportUDP::connect(const std::string &, int, int)"
                           ,"Couldn\'t find an AF_INET address for [%s]\n",uVar8);
            uVar10 = extraout_RAX_01;
          }
          local_9 = 0;
          goto LAB_00506869;
        }
        if (((console::g_initialized ^ 0xff) & 1) != 0) {
          console::initialize();
        }
        if (((connect(std::__cxx11::string_const&,int,int)::loc.initialized_ ^ 0xffU) & 1) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
                     in_stack_fffffffffffffc08,(allocator<char> *)in_stack_fffffffffffffc00);
          console::initializeLogLocation
                    (in_stack_fffffffffffffc00,
                     (string *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),level);
          std::__cxx11::string::~string(local_120);
          std::allocator<char>::~allocator(&local_121);
        }
        if (connect(std::__cxx11::string_const&,int,int)::loc.level_ != Debug) {
          console::setLogLocationLevel(in_stack_fffffffffffffbd0,LVar14);
          console::checkLogLocationEnabled(in_stack_fffffffffffffbe0);
        }
        pvVar13 = connect(std::__cxx11::string_const&,int,int)::loc.logger_;
        LVar1 = connect(std::__cxx11::string_const&,int,int)::loc.level_;
        local_122 = (connect(std::__cxx11::string_const&,int,int)::loc.logger_enabled_ & 1U) != 0;
        if ((bool)local_122) {
          in_stack_fffffffffffffbd0 = (LogLocation *)std::__cxx11::string::c_str();
          local_128 = local_70._4_4_;
          pcVar7 = inet_ntoa((in_addr)local_70._4_4_);
          LVar14 = Debug;
          console::print((FilterBase *)0x0,pvVar13,(Level)(ulong)LVar1,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_udp.cpp"
                         ,0xcc,"bool miniros::TransportUDP::connect(const std::string &, int, int)",
                         "Resolved host [%s] to [%s]",in_stack_fffffffffffffbd0,pcVar7);
          uVar11 = (undefined4)((ulong)pcVar7 >> 0x20);
        }
      }
      else {
        pcVar7 = (char *)std::__cxx11::string::c_str();
        local_70._4_4_ = inet_addr(pcVar7);
      }
      local_70._2_2_ = htons((uint16_t)local_24);
      iVar4 = ::connect(this->sock_,(sockaddr *)local_70,0x10);
      if (iVar4 == 0) {
        std::__cxx11::stringstream::stringstream(local_2d8);
        poVar9 = std::operator<<(local_2c8,local_20);
        poVar9 = std::operator<<(poVar9,":");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_24);
        poVar9 = std::operator<<(poVar9," on socket ");
        std::ostream::operator<<(poVar9,this->sock_);
        std::__cxx11::stringstream::str();
        this_00 = local_2f8;
        std::__cxx11::string::operator=((string *)&this->cached_remote_host_,this_00);
        std::__cxx11::string::~string(this_00);
        uVar3 = initializeSocket(in_stack_fffffffffffffcc8);
        if ((bool)uVar3) {
          if (((console::g_initialized ^ 0xff) & 1) != 0) {
            console::initialize();
          }
          if (((connect(std::__cxx11::string_const&,int,int)::loc.initialized_ ^ 0xffU) & 1) != 0) {
            loc = local_321;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(uVar3,in_stack_fffffffffffffc10),(char *)this_00,
                       (allocator<char> *)loc);
            console::initializeLogLocation
                      (loc,(string *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                       level);
            std::__cxx11::string::~string((string *)&local_321[0].logger_enabled_);
            std::allocator<char>::~allocator((allocator<char> *)local_321);
          }
          if (connect(std::__cxx11::string_const&,int,int)::loc.level_ != Debug) {
            console::setLogLocationLevel(in_stack_fffffffffffffbd0,LVar14);
            console::checkLogLocationEnabled(in_stack_fffffffffffffbe0);
          }
          uVar12 = (undefined4)((ulong)in_stack_fffffffffffffbe0 >> 0x20);
          if ((connect(std::__cxx11::string_const&,int,int)::loc.logger_enabled_ & 1U) != 0) {
            pvVar13 = connect(std::__cxx11::string_const&,int,int)::loc.logger_;
            LVar14 = connect(std::__cxx11::string_const&,int,int)::loc.level_;
            uVar8 = std::__cxx11::string::c_str();
            console::print((FilterBase *)0x0,pvVar13,(Level)(ulong)LVar14,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_udp.cpp"
                           ,0xed,
                           "bool miniros::TransportUDP::connect(const std::string &, int, int)",
                           "Connect succeeded to [%s:%d] on socket [%d]",uVar8,
                           CONCAT44(uVar11,local_24),CONCAT44(uVar12,this->sock_));
          }
          local_9 = 1;
        }
        else {
          local_9 = 0;
        }
        local_2fc = 1;
        uVar10 = std::__cxx11::stringstream::~stringstream(local_2d8);
      }
      else {
        if (((console::g_initialized ^ 0xff) & 1) != 0) {
          console::initialize();
        }
        if (((connect(std::__cxx11::string_const&,int,int)::loc.initialized_ ^ 0xffU) & 1) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
                     in_stack_fffffffffffffc08,(allocator<char> *)in_stack_fffffffffffffc00);
          console::initializeLogLocation
                    (in_stack_fffffffffffffc00,
                     (string *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),level);
          std::__cxx11::string::~string(local_148);
          std::allocator<char>::~allocator(&local_149);
        }
        if (connect(std::__cxx11::string_const&,int,int)::loc.level_ != Debug) {
          console::setLogLocationLevel(in_stack_fffffffffffffbd0,LVar14);
          console::checkLogLocationEnabled(in_stack_fffffffffffffbe0);
        }
        pvVar13 = connect(std::__cxx11::string_const&,int,int)::loc.logger_;
        LVar14 = connect(std::__cxx11::string_const&,int,int)::loc.level_;
        if ((connect(std::__cxx11::string_const&,int,int)::loc.logger_enabled_ & 1U) != 0) {
          uVar8 = std::__cxx11::string::c_str();
          iVar4 = local_24;
          pcVar7 = last_socket_error_string();
          console::print((FilterBase *)0x0,pvVar13,(Level)(ulong)LVar14,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_udp.cpp"
                         ,0xd7,"bool miniros::TransportUDP::connect(const std::string &, int, int)",
                         "Connect to udpros host [%s:%d] failed with error [%s]",uVar8,
                         CONCAT44(uVar11,iVar4),pcVar7);
        }
        uVar6 = (*(this->super_Transport)._vptr_Transport[8])();
        uVar10 = (ulong)uVar6;
        local_9 = 0;
      }
    }
  }
  else {
    local_9 = 0;
  }
LAB_00506869:
  return (uint)CONCAT71((int7)(uVar10 >> 8),local_9) & 0xffffff01;
}

Assistant:

bool TransportUDP::connect(const std::string& host, int port, int connection_id)
{
  if (!isHostAllowed(host))
    return false; // adios amigo

  sock_ = socket(AF_INET, SOCK_DGRAM, 0);
  connection_id_ = connection_id;

  if (sock_ == ROS_INVALID_SOCKET)
  {
    MINIROS_ERROR("socket() failed with error [%s]",  last_socket_error_string());
    return false;
  }

  sockaddr_in sin = {};
  sin.sin_family = AF_INET;
  if (inet_addr(host.c_str()) == INADDR_NONE)
  {
    struct addrinfo* addr;
    struct addrinfo hints;
    memset(&hints, 0, sizeof(hints));
    hints.ai_family = AF_UNSPEC;

    if (getaddrinfo(host.c_str(), NULL, &hints, &addr) != 0)
    {
      close();
      MINIROS_ERROR("couldn't resolve host [%s]", host.c_str());
      return false;
    }

    bool found = false;
    struct addrinfo* it = addr;
    for (; it; it = it->ai_next)
    {
      if (it->ai_family == AF_INET)
      {
        memcpy(&sin, it->ai_addr, it->ai_addrlen);
        sin.sin_family = it->ai_family;
        sin.sin_port = htons(port);

        found = true;
        break;
      }
    }

    freeaddrinfo(addr);

    if (!found)
    {
      MINIROS_ERROR("Couldn't find an AF_INET address for [%s]\n", host.c_str());
      return false;
    }

    MINIROS_DEBUG("Resolved host [%s] to [%s]", host.c_str(), inet_ntoa(sin.sin_addr));
  }
  else
  {
    sin.sin_addr.s_addr = inet_addr(host.c_str()); // already an IP addr
  }

  sin.sin_port = htons(port);

  if (::connect(sock_, (sockaddr *)&sin, sizeof(sin)))
  {
    MINIROS_DEBUG("Connect to udpros host [%s:%d] failed with error [%s]", host.c_str(), port,  last_socket_error_string());
    close();

    return false;
  }

  // from daniel stonier:
#ifdef WIN32
  // This is hackish, but windows fails at recv() if its slow to connect (e.g. happens with wireless)
  // recv() needs to check if its connected or not when its asynchronous?
  Sleep(100);
#endif

  std::stringstream ss;
  ss << host << ":" << port << " on socket " << sock_;
  cached_remote_host_ = ss.str();

  if (!initializeSocket())
  {
    return false;
  }

  MINIROS_DEBUG("Connect succeeded to [%s:%d] on socket [%d]", host.c_str(), port, sock_);

  return true;
}